

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

void Aig_ManDupPartAll_rec(Aig_Man_t *pNew,Aig_Man_t *pOld,Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  uint uVar4;
  Aig_Obj_t *p1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x429,"void Aig_ManDupPartAll_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
  }
  if (pObj->TravId != pOld->nTravIds) {
    pObj->TravId = pOld->nTravIds;
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar4 = uVar1 & 7;
    if (uVar4 == 3) {
      Aig_ManDupPartAll_rec(pNew,pOld,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar3 == 0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar2 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar3 + 0x28));
      }
      pAVar2 = Aig_ObjCreateCo(pNew,pAVar2);
    }
    else if (uVar4 == 2) {
      pAVar2 = Aig_ObjCreateCi(pNew);
    }
    else {
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x436,"void Aig_ManDupPartAll_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
      }
      Aig_ManDupPartAll_rec(pNew,pOld,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Aig_ManDupPartAll_rec(pNew,pOld,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar3 == 0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar2 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar3 + 0x28));
      }
      uVar3 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar3 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar3 + 0x28));
      }
      pAVar2 = Aig_And(pNew,pAVar2,p1);
    }
    (pObj->field_5).pData = pAVar2;
    (pAVar2->field_5).pData = pObj;
  }
  return;
}

Assistant:

void Aig_ManDupPartAll_rec( Aig_Man_t * pNew, Aig_Man_t * pOld, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(pOld, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pOld, pObj);
    if ( Aig_ObjIsCi(pObj) )
        pObjNew = Aig_ObjCreateCi(pNew);
    else if ( Aig_ObjIsCo(pObj) )
    {
        Aig_ManDupPartAll_rec( pNew, pOld, Aig_ObjFanin0(pObj) );
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Aig_ManDupPartAll_rec( pNew, pOld, Aig_ObjFanin0(pObj) );
        Aig_ManDupPartAll_rec( pNew, pOld, Aig_ObjFanin1(pObj) );
        pObjNew = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    pObj->pData = pObjNew;
    pObjNew->pData = pObj;
}